

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

bool __thiscall
Clasp::Asp::PrgAtom::addConstraints(PrgAtom *this,LogicProgram *prg,ClauseCreator *gc)

{
  EdgeVec *this_00;
  SharedContext *this_01;
  PrgNode PVar1;
  pointer pVVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ClauseCreator *pCVar6;
  iterator pPVar7;
  byte bVar8;
  iterator pPVar9;
  iterator first;
  byte bVar10;
  Result RVar11;
  Literal B;
  Literal local_34;
  
  this_01 = (prg->super_ProgramBuilder).ctx_;
  this_00 = &(this->super_PrgHead).supports_;
  first = (this->super_PrgHead).supports_.ebo_.buf;
  pCVar6 = ClauseCreator::start(gc,Static);
  local_34.rep_ = *(int *)&(this->super_PrgHead).super_PrgNode * 2 ^ 2;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
            (&pCVar6->literals_,&local_34);
  pPVar7 = (this->super_PrgHead).supports_.ebo_.buf;
  pPVar9 = pPVar7;
  bVar10 = 0;
  do {
    if (pPVar9 == pPVar7 + (this->super_PrgHead).supports_.ebo_.size) {
      bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::erase
                (this_00,first,pPVar7 + (this->super_PrgHead).supports_.ebo_.size);
      if (((bVar10 & 1) != 0) || (bVar4 = hasDep(this,dep_neg), bVar4)) {
        uVar5 = *(uint *)&(this->super_PrgHead).super_PrgNode >> 1 & 0x3fffffff;
        pVVar2 = (this_01->varInfo_).ebo_.buf;
        bVar10 = pVVar2[uVar5].rep;
        if ((bVar10 & 0x20) == 0) {
          pVVar2[uVar5].rep = bVar10 | 0x20;
        }
      }
      RVar11 = ClauseCreator::end(gc,0x100);
      return ((undefined1  [16])RVar11 & (undefined1  [16])0x2) == (undefined1  [16])0x0;
    }
    uVar5 = pPVar9->rep;
    PVar1 = (&prg->bodies_)[(ulong)((uVar5 & 0xc) != 4) * 2].ebo_.buf[uVar5 >> 4]->super_PrgNode;
    uVar3 = PVar1._0_4_;
    B.rep_ = uVar3 * 2;
    bVar8 = bVar10;
    if ((uVar3 & 0x7fffffff) != 1 && (PVar1._7_1_ >> 6 & 1) == 0) {
      first->rep = uVar5;
      uVar5 = pPVar9->rep;
      bVar8 = (byte)uVar5 >> 1;
      if ((bVar10 & 1) != 0) {
        bVar8 = 1;
      }
      if ((uVar5 & 0xc) != 8) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                  (&gc->literals_,&B);
        uVar5 = pPVar9->rep;
      }
      first = first + 1;
      if (((uVar5 & 2) == 0) &&
         (bVar4 = SharedContext::addBinary
                            (this_01,(Literal)(*(int *)&(this->super_PrgHead).super_PrgNode * 2),
                             (Literal)(B.rep_ & 0xfffffffe ^ 2)), !bVar4)) {
        return false;
      }
    }
    pPVar9 = pPVar9 + 1;
    pPVar7 = (this_00->ebo_).buf;
    bVar10 = bVar8;
  } while( true );
}

Assistant:

bool PrgAtom::addConstraints(const LogicProgram& prg, ClauseCreator& gc) {
	SharedContext& ctx  = *prg.ctx();
	EdgeVec::iterator j = supports_.begin();
	bool           nant = false;
	gc.start().add(~literal());
	for (EdgeVec::iterator it = supports_.begin(); it != supports_.end(); ++it) {
		PrgNode* n = prg.getSupp(*it);
		Literal  B = n->literal();
		// consider only bodies which are part of the simplified program, i.e.
		// are associated with a variable in the solver.
		if (n->relevant() && n->hasVar()) {
			*j++ = *it;
			nant = nant || it->isChoice();
			if (!it->isDisj()) { gc.add(B); }
			if (it->isNormal() && !ctx.addBinary(literal(), ~B)) { // FTA/BFA
				return false;
			}
		}
	}
	supports_.erase(j, supports_.end());
	if (nant ||	hasDep(PrgAtom::dep_neg)) { ctx.setNant(var(), true); }
	return gc.end(ClauseCreator::clause_force_simplify);
}